

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O1

unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
__thiscall sf2cute::SoundFontWriter::MakeInfoListChunk(SoundFontWriter *this)

{
  SoundFont *this_00;
  long *in_RSI;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this_00 = (SoundFont *)operator_new(0x40);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"INFO","");
  RIFFListChunk::RIFFListChunk((RIFFListChunk *)this_00,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"ifil","");
  MakeVersionChunk((SoundFontWriter *)&local_2c0,&local_160,(SFVersionTag)0x10002);
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)this_00,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_2c0._M_dataplus._M_p + 8))();
  }
  local_2c0._M_dataplus._M_p = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"isng","");
  std::__cxx11::string::substr((ulong)&local_40,*in_RSI + 0x48);
  MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_180,&local_40);
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)this_00,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_2c0);
  if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
  }
  local_2c0._M_dataplus._M_p = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"INAM","");
  std::__cxx11::string::substr((ulong)&local_60,*in_RSI + 0x68);
  MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_1a0,&local_60);
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)this_00,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_2c0);
  if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
  }
  local_2c0._M_dataplus._M_p = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(*in_RSI + 0x90) != 0) {
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"irom","");
    std::__cxx11::string::substr((ulong)&local_80,*in_RSI + 0x88);
    MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_1c0,&local_80);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(char *)(*in_RSI + 0xac) == '\x01') {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"iver","");
    MakeVersionChunk((SoundFontWriter *)&local_2c0,&local_1e0,*(SFVersionTag *)(*in_RSI + 0xa8));
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(*in_RSI + 0xb8) != 0) {
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"ICRD","");
    std::__cxx11::string::substr((ulong)&local_a0,*in_RSI + 0xb0);
    MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_200,&local_a0);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(*in_RSI + 0xd8) != 0) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"IENG","");
    std::__cxx11::string::substr((ulong)&local_c0,*in_RSI + 0xd0);
    MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_220,&local_c0);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(*in_RSI + 0xf8) != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"IPRD","");
    std::__cxx11::string::substr((ulong)&local_e0,*in_RSI + 0xf0);
    MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_240,&local_e0);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(*in_RSI + 0x118) != 0) {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"ICOP","");
    std::__cxx11::string::substr((ulong)&local_100,*in_RSI + 0x110);
    MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_260,&local_100);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(*in_RSI + 0x138) != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ICMT","");
    std::__cxx11::string::substr((ulong)&local_120,*in_RSI + 0x130);
    MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_280,&local_120);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(*in_RSI + 0x158) != 0) {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"ISFT","");
    std::__cxx11::string::substr((ulong)&local_140,*in_RSI + 0x150);
    MakeZSTRChunk((SoundFontWriter *)&local_2c0,&local_2a0,&local_140);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)this_00,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2c0);
    if ((long *)local_2c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
    }
    local_2c0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
  }
  this->file_ = this_00;
  return (__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
          )(__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RIFFChunkInterface> SoundFontWriter::MakeInfoListChunk() {
  std::unique_ptr<RIFFListChunk> info = std::make_unique<RIFFListChunk>("INFO");

  // Mandatory chunks:

  info->AddSubchunk(MakeVersionChunk("ifil", SFVersionTag(2, 1)));

  info->AddSubchunk(MakeZSTRChunk("isng", file().sound_engine().substr(0, SoundFont::kInfoTextMaxLength)));

  info->AddSubchunk(MakeZSTRChunk("INAM", file().bank_name().substr(0, SoundFont::kInfoTextMaxLength)));

  // Optional chunks:

  if (file().has_rom_name()) {
    info->AddSubchunk(MakeZSTRChunk("irom", file().rom_name().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_rom_version()) {
    info->AddSubchunk(MakeVersionChunk("iver", file().rom_version()));
  }

  if (file().has_creation_date()) {
    info->AddSubchunk(MakeZSTRChunk("ICRD", file().creation_date().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_engineers()) {
    info->AddSubchunk(MakeZSTRChunk("IENG", file().engineers().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_product()) {
    info->AddSubchunk(MakeZSTRChunk("IPRD", file().product().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_copyright()) {
    info->AddSubchunk(MakeZSTRChunk("ICOP", file().copyright().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_comment()) {
    info->AddSubchunk(MakeZSTRChunk("ICMT", file().comment().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_software()) {
    info->AddSubchunk(MakeZSTRChunk("ISFT", file().software().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  return std::move(info);
}